

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O1

void __thiscall icu_63::RangeDescriptor::setDictionaryFlag(RangeDescriptor *this)

{
  byte *pbVar1;
  int *piVar2;
  bool bVar3;
  int8_t iVar4;
  void *pvVar5;
  int length;
  int index;
  UVector *this_00;
  
  this_00 = this->fIncludesSets;
  if (0 < this_00->count) {
    index = 0;
    do {
      pvVar5 = UVector::elementAt(this_00,index);
      if (*(long *)((long)pvVar5 + 8) != 0) {
        piVar2 = *(int **)(*(long *)((long)pvVar5 + 8) + 8);
        if ((piVar2 == (int *)0x0) || (*piVar2 != 2)) {
LAB_00159631:
          bVar3 = false;
        }
        else {
          if ((short)piVar2[0xe] < 0) {
            length = piVar2[0xf];
          }
          else {
            length = (int)(short)piVar2[0xe] >> 5;
          }
          iVar4 = UnicodeString::doCompare
                            ((UnicodeString *)(piVar2 + 0xc),0,length,L"dictionary",0,-1);
          if (iVar4 != '\0') goto LAB_00159631;
          pbVar1 = (byte *)((long)&this->fNum + 1);
          *pbVar1 = *pbVar1 | 0x40;
          bVar3 = true;
        }
        if (bVar3) {
          return;
        }
      }
      index = index + 1;
      this_00 = this->fIncludesSets;
    } while (index < this_00->count);
  }
  return;
}

Assistant:

void RangeDescriptor::setDictionaryFlag() {
    int i;

    static const char16_t *dictionary = u"dictionary";
    for (i=0; i<fIncludesSets->size(); i++) {
        RBBINode *usetNode  = (RBBINode *)fIncludesSets->elementAt(i);
        RBBINode *setRef = usetNode->fParent;
        if (setRef != nullptr) {
            RBBINode *varRef = setRef->fParent;
            if (varRef && varRef->fType == RBBINode::varRef) {
                const UnicodeString *setName = &varRef->fText;
                if (setName->compare(dictionary, -1) == 0) {
                    fNum |= RBBISetBuilder::DICT_BIT;
                    break;
                }
            }
        }
    }
}